

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.h
# Opt level: O2

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>_>::TPZGeoElMapped
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>_> *this,void **vtt)

{
  void *pvVar1;
  double local_20;
  
  TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern
            (&this->super_TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>,vtt + 1);
  pvVar1 = *vtt;
  *(void **)&(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>).
             super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>.super_TPZGeoEl = pvVar1;
  *(void **)(&(((TPZGeoElRefLess<pzgeom::TPZGeoTriangle> *)
               (&(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>).
                 super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>.fGeo + -2))->super_TPZGeoEl).
              field_0x0 + *(long *)((long)pvVar1 + -0x60)) = vtt[7];
  local_20 = 0.0;
  TPZFNMatrix<6,_double>::TPZFNMatrix(&this->fCornerCo,2,3,&local_20);
  return;
}

Assistant:

TPZGeoElMapped() : TPZRegisterClassId(&TPZGeoElMapped::ClassId),
    TBase(), fCornerCo(Geo::Dimension,Geo::NNodes,0.)
	{
	}